

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUuid.cxx
# Opt level: O3

string * __thiscall
cmUuid::FromDigest_abi_cxx11_
          (string *__return_storage_ptr__,cmUuid *this,uchar *digest,uchar version)

{
  undefined8 uVar1;
  byte bVar2;
  undefined6 local_18;
  byte bStack_12;
  undefined1 uStack_11;
  ulong uStack_10;
  
  uVar1 = *(undefined8 *)digest;
  bStack_12 = (byte)((ulong)uVar1 >> 0x30);
  bVar2 = bStack_12 & 0xf;
  uStack_11 = (undefined1)((ulong)uVar1 >> 0x38);
  _local_18 = CONCAT16(version << 4 | bVar2,(int6)uVar1);
  uStack_10 = *(ulong *)(digest + 8) & 0xffffffffffffff3f | 0x80;
  BinaryToString_abi_cxx11_(__return_storage_ptr__,this,(uchar *)&local_18);
  return __return_storage_ptr__;
}

Assistant:

std::string cmUuid::FromDigest(const unsigned char* digest,
                               unsigned char version) const
{
  using byte_t = unsigned char;

  byte_t uuid[16] = { 0 };
  memcpy(uuid, digest, 16);

  uuid[6] &= 0xF;
  uuid[6] |= static_cast<byte_t>(version << 4);

  uuid[8] &= 0x3F;
  uuid[8] |= 0x80;

  return this->BinaryToString(uuid);
}